

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase212::run(TestCase212 *this)

{
  Reader brand;
  bool bVar1;
  uint64_t uVar2;
  ArrayPtr<const_char> AVar3;
  Reader local_2f8;
  ArrayPtr<const_char> local_2c8;
  Schema local_2b8;
  Reader local_2b0;
  ArrayPtr<const_char> local_280;
  bool local_269;
  undefined1 local_268 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_238;
  Schema local_228;
  Reader local_220;
  ArrayPtr<const_char> local_1f0;
  RawBrandedSchema *local_1e0;
  Reader local_1d8;
  String local_1a8;
  Schema local_190;
  Reader local_188;
  String local_158;
  bool local_139;
  undefined1 local_138 [7];
  bool _kj_shouldLog;
  String local_108;
  StringPtr local_f0;
  Schema local_e0;
  Reader local_d8;
  String local_a8;
  Schema local_90;
  Reader local_88;
  Schema local_58;
  Schema local_50;
  StructSchema schema;
  undefined1 local_38 [8];
  SchemaLoader loader;
  TestCase212 *this_local;
  
  loader.impl.value.ptr = (Impl *)this;
  SchemaLoader::SchemaLoader((SchemaLoader *)local_38);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestNewVersion>
            ((SchemaLoader *)local_38);
  uVar2 = typeId<capnproto_test::capnp::test::TestNewVersion,capnproto_test::capnp::test::TestNewVersion::_capnpPrivate>
                    ();
  local_88._reader.dataSize = 0;
  local_88._reader.pointerCount = 0;
  local_88._reader._38_2_ = 0;
  local_88._reader.nestingLimit = 0;
  local_88._reader._44_4_ = 0;
  local_88._reader.data = (void *)0x0;
  local_88._reader.pointers = (WirePointer *)0x0;
  local_88._reader.segment = (SegmentReader *)0x0;
  local_88._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_88);
  Schema::Schema(&local_90);
  brand._reader.capTable = local_88._reader.capTable;
  brand._reader.segment = local_88._reader.segment;
  brand._reader.data = local_88._reader.data;
  brand._reader.pointers = local_88._reader.pointers;
  brand._reader.dataSize = local_88._reader.dataSize;
  brand._reader.pointerCount = local_88._reader.pointerCount;
  brand._reader._38_2_ = local_88._reader._38_2_;
  brand._reader.nestingLimit = local_88._reader.nestingLimit;
  brand._reader._44_4_ = local_88._reader._44_4_;
  local_58 = SchemaLoader::get((SchemaLoader *)local_38,uVar2,brand,local_90);
  local_50.raw = (RawBrandedSchema *)Schema::asStruct(&local_58);
  local_e0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
  Schema::getProto(&local_d8,&local_e0);
  kj::str<capnp::schema::Node::Reader>(&local_a8,&local_d8);
  Schema::getProto((Reader *)local_138,&local_50);
  kj::str<capnp::schema::Node::Reader>(&local_108,(Reader *)local_138);
  kj::StringPtr::StringPtr(&local_f0,&local_108);
  bVar1 = kj::String::operator==(&local_a8,&local_f0);
  kj::String::~String(&local_108);
  kj::String::~String(&local_a8);
  if (!bVar1) {
    local_139 = kj::_::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      local_190.raw =
           (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
      Schema::getProto(&local_188,&local_190);
      kj::str<capnp::schema::Node::Reader>(&local_158,&local_188);
      Schema::getProto(&local_1d8,&local_50);
      kj::str<capnp::schema::Node::Reader>(&local_1a8,&local_1d8);
      kj::_::Debug::log<char_const(&)[108],kj::String,kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))\", kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto())"
                 ,(char (*) [108])
                  "failed: expected (kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))"
                 ,&local_158,&local_1a8);
      kj::String::~String(&local_1a8);
      kj::String::~String(&local_158);
      local_139 = false;
    }
  }
  uVar2 = typeId<capnproto_test::capnp::test::TestNewVersion,capnproto_test::capnp::test::TestNewVersion::_capnpPrivate>
                    ();
  local_1e0 = (RawBrandedSchema *)
              loadUnderAlternateTypeId<capnproto_test::capnp::test::TestOldVersion>
                        ((SchemaLoader *)local_38,uVar2);
  local_228.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
  Schema::getProto(&local_220,&local_228);
  local_1f0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_220);
  Schema::getProto((Reader *)local_268,&local_50);
  local_238 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_268)
  ;
  bVar1 = kj::StringPtr::operator==((StringPtr *)&local_1f0,(StringPtr *)&local_238);
  if (!bVar1) {
    local_269 = kj::_::Debug::shouldLog(ERROR);
    while (local_269 != false) {
      local_2b8.raw =
           (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
      Schema::getProto(&local_2b0,&local_2b8);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_2b0);
      local_280 = AVar3;
      Schema::getProto(&local_2f8,&local_50);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_2f8);
      local_2c8 = AVar3;
      kj::_::Debug::log<char_const(&)[124],capnp::Text::Reader,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
                 ,(char (*) [124])
                  "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
                 ,(Reader *)&local_280,(Reader *)&local_2c8);
      local_269 = false;
    }
  }
  Schema::requireUsableAs<capnproto_test::capnp::test::TestNewVersion>(&local_50);
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_38);
  return;
}

Assistant:

TEST(SchemaLoader, Downgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestNewVersion>();

  StructSchema schema = loader.get(typeId<test::TestNewVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestOldVersion>(loader, typeId<test::TestNewVersion>());

  // We kept the new version, because the replacement was older.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());
  schema.requireUsableAs<test::TestNewVersion>();
}